

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O1

tokens __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::ScanIdentifier
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,bool identifyKwds,EncodedCharPtr *pp)

{
  EncodedCharPtr pchMin;
  size_t sVar1;
  EncodedCharPtr last;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  OLECHAR OVar5;
  tokens tVar6;
  undefined4 *puVar7;
  EncodedCharPtr local_48;
  EncodedCharPtr p;
  codepoint_t local_38;
  codepoint_t ch;
  codepoint_t codePoint;
  bool fHasMultiChar;
  
  pchMin = *pp;
  ch._3_1_ = 0;
  local_38 = 0xffffffff;
  sVar1 = (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits;
  last = this->m_pchLast;
  local_48 = pchMin;
  if (last <= pchMin) {
    bVar3 = false;
    bVar4 = false;
    goto LAB_00f16a25;
  }
  OVar5 = UTF8EncodingPolicyBase<false>::ReadFull<true>
                    (&this->super_UTF8EncodingPolicyBase<false>,&local_48,last);
  p._4_4_ = (uint)(ushort)OVar5;
  if (p._4_4_ < 0x80) {
    if ((ushort)OVar5 != 0x5c) goto LAB_00f16a1a;
    bVar3 = TryReadEscape(this,&local_48,last,(codepoint_t *)((long)&p + 4));
  }
  else {
    ch._3_1_ = 1;
    if (this->es6UnicodeMode == true) {
      bVar3 = Js::NumberUtilities::IsSurrogateLowerPart((uint)(ushort)OVar5);
      if (bVar3) {
        bVar4 = TryReadCodePointRest<true>
                          (this,p._4_4_,&local_48,last,&local_38,(bool *)((long)&ch + 3));
        bVar3 = false;
        goto LAB_00f16a25;
      }
    }
LAB_00f16a1a:
    bVar3 = false;
  }
  local_38 = p._4_4_;
  bVar4 = true;
LAB_00f16a25:
  tVar6 = tkLastKwd;
  if (bVar4 != false) {
    if (0x10ffff < local_38) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                         ,0x1a5,"(codePoint < 0x110000u)","codePoint < 0x110000u");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
    bVar4 = Js::CharClassifier::IsIdStart(this->charClassifier,local_38);
    if (bVar4) {
      tVar6 = ScanIdentifierContinue(this,identifyKwds,bVar3,(bool)ch._3_1_,pchMin,local_48,pp);
    }
    else {
      (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits = sVar1;
    }
  }
  return tVar6;
}

Assistant:

tokens Scanner<EncodingPolicy>::ScanIdentifier(bool identifyKwds, EncodedCharPtr *pp)
{
    EncodedCharPtr p = *pp;
    EncodedCharPtr pchMin = p;

    // JS6 allows unicode characters in the form of \uxxxx escape sequences
    // to be part of the identifier.
    bool fHasEscape = false;
    bool fHasMultiChar = false;

    codepoint_t codePoint = INVALID_CODEPOINT;
    size_t multiUnitsBeforeLast = this->m_cMultiUnits;

    // Check if we started the id
    if (!TryReadCodePoint<true>(p, m_pchLast, &codePoint, &fHasEscape, &fHasMultiChar))
    {
        // If no chars. could be scanned as part of the identifier, return error.
        return tkScanError;
    }

    Assert(codePoint < 0x110000u);
    if (!charClassifier->IsIdStart(codePoint))
    {
        // Put back the last character
        this->RestoreMultiUnits(multiUnitsBeforeLast);

        // If no chars. could be scanned as part of the identifier, return error.
        return tkScanError;
    }

    return ScanIdentifierContinue(identifyKwds, fHasEscape, fHasMultiChar, pchMin, p, pp);
}